

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequences.hpp
# Opt level: O2

iterator_range<burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
* __thiscall
burst::subsequences<std::initializer_list<int>const&>
          (iterator_range<burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
           *__return_storage_ptr__,burst *this,initializer_list<int> *range)

{
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> *in_RCX
  ;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> begin;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_e8;
  int *local_b8;
  int *piStack_b0;
  _Vector_base<const_int_*,_std::allocator<const_int_*>_> local_a8;
  difference_type dStack_90;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_88;
  int *local_58;
  int *piStack_50;
  _Vector_base<const_int_*,_std::allocator<const_int_*>_> local_48;
  undefined8 uStack_30;
  
  make_subsequence_iterator<std::initializer_list<int>const&>(&local_88,this,range);
  local_58 = local_88.m_begin;
  piStack_50 = local_88.m_end;
  local_b8 = local_88.m_begin;
  piStack_b0 = local_88.m_end;
  local_a8._M_impl.super__Vector_impl_data._M_start =
       local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8._M_impl.super__Vector_impl_data._M_finish =
       local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  dStack_90 = local_88.m_subsequence_size;
  local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.m_begin = local_88.m_begin;
  local_e8.m_end = local_88.m_end;
  local_e8.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.m_subsequence_size = 0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_30 = 0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  boost::
  make_iterator_range<burst::subsequence_iterator<int_const*,std::vector<int_const*,std::allocator<int_const*>>>>
            (__return_storage_ptr__,(boost *)&local_b8,&local_e8,in_RCX);
  std::_Vector_base<const_int_*,_std::allocator<const_int_*>_>::~_Vector_base
            (&local_e8.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>);
  std::_Vector_base<const_int_*,_std::allocator<const_int_*>_>::~_Vector_base(&local_a8);
  std::_Vector_base<const_int_*,_std::allocator<const_int_*>_>::~_Vector_base(&local_48);
  std::_Vector_base<const_int_*,_std::allocator<const_int_*>_>::~_Vector_base
            (&local_88.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>);
  return __return_storage_ptr__;
}

Assistant:

auto subsequences (ForwardRange && range)
    {
        auto begin = make_subsequence_iterator(std::forward<ForwardRange>(range));
        auto end = make_subsequence_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }